

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile.hpp
# Opt level: O0

void __thiscall CompoundFile::File::initialize(File *this,string *fileName)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __beg;
  SecID SVar1;
  int32_t iVar2;
  ulong uVar3;
  wstring *what;
  istream *in_RDI;
  Stream *this_00;
  istream *piVar4;
  Directory rootEntry;
  Directory root;
  Stream stream;
  MSAT msat;
  Directory *in_stack_fffffffffffffd28;
  Stream *in_stack_fffffffffffffd30;
  Directory *in_stack_fffffffffffffd40;
  Exception *this_01;
  Header *in_stack_fffffffffffffd48;
  MSAT *in_stack_fffffffffffffd50;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  map<int,_CompoundFile::Directory,_std::less<int>,_std::allocator<std::pair<const_int,_CompoundFile::Directory>_>_>
  *this_02;
  undefined6 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbe;
  undefined1 in_stack_fffffffffffffdbf;
  Directory *in_stack_fffffffffffffdc0;
  Header *in_stack_fffffffffffffdc8;
  Stream *in_stack_fffffffffffffdd0;
  SAT *in_stack_fffffffffffffde8;
  Stream *in_stack_fffffffffffffdf0;
  Directory *in_stack_fffffffffffffdf8;
  map<int,_CompoundFile::Directory,_std::less<int>,_std::allocator<std::pair<const_int,_CompoundFile::Directory>_>_>
  *in_stack_fffffffffffffe00;
  Directory local_148;
  int32_t local_10c;
  map<int,_CompoundFile::Directory,_std::less<int>,_std::allocator<std::pair<const_int,_CompoundFile::Directory>_>_>
  local_78 [2];
  
  uVar3 = std::ios::good();
  if ((uVar3 & 1) == 0) {
    what = (wstring *)__cxa_allocate_exception(0x30);
    this_01 = (Exception *)&stack0xfffffffffffffdf7;
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring
              ((wstring *)&stack0xfffffffffffffdf8,L"Unable to open file : ",(allocator *)this_01);
    std::__cxx11::string::cbegin();
    std::__cxx11::string::cend();
    std::allocator<wchar_t>::allocator();
    __beg._M_current._4_4_ = in_stack_fffffffffffffd64;
    __beg._M_current._0_4_ = in_stack_fffffffffffffd60;
    std::__cxx11::wstring::
    wstring<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               in_stack_fffffffffffffd50,__beg,in_stack_fffffffffffffd58,
               (allocator<wchar_t> *)in_stack_fffffffffffffd48);
    std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                   (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    Exception::Exception(this_01,what);
    __cxa_throw(what,&Exception::typeinfo,Exception::~Exception);
  }
  this_00 = (Stream *)(in_RDI + 0x210);
  Header::load((Header *)in_stack_fffffffffffffdc0,
               (istream *)
               CONCAT17(in_stack_fffffffffffffdbf,
                        CONCAT16(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8)));
  MSAT::MSAT(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             (istream *)in_stack_fffffffffffffd40);
  MSAT::buildSAT((MSAT *)CONCAT17(in_stack_fffffffffffffdbf,
                                  CONCAT16(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8)));
  piVar4 = in_RDI + 0x238;
  SAT::operator=((SAT *)in_stack_fffffffffffffd30,(SAT *)in_stack_fffffffffffffd28);
  SAT::~SAT((SAT *)0x12c1d6);
  loadSSAT((Header *)in_stack_fffffffffffffdf8,(istream *)in_stack_fffffffffffffdf0,
           in_stack_fffffffffffffde8);
  this_02 = local_78;
  SAT::operator=((SAT *)in_stack_fffffffffffffd30,(SAT *)in_stack_fffffffffffffd28);
  SAT::~SAT((SAT *)0x12c22e);
  local_10c = (int32_t)Header::dirStreamSecID((Header *)(in_RDI + 0x210));
  Stream::Stream(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                 (SAT *)in_stack_fffffffffffffdc0,
                 (SecID *)CONCAT17(in_stack_fffffffffffffdbf,
                                   CONCAT16(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8)),
                 in_RDI);
  Directory::Directory(in_stack_fffffffffffffd40);
  Directory::load(in_stack_fffffffffffffdc0,
                  (Stream *)
                  CONCAT17(in_stack_fffffffffffffdbf,
                           CONCAT16(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8)));
  SVar1 = Directory::streamSecID(&local_148);
  *(int32_t *)(in_RDI + 0x268) = SVar1.m_id;
  iVar2 = Directory::rootNode(&local_148);
  Stream::seek(this_00,(int32_t)((ulong)piVar4 >> 0x20),(SeekType)piVar4);
  Directory::Directory(in_stack_fffffffffffffd40);
  Directory::load(in_stack_fffffffffffffdc0,
                  (Stream *)
                  CONCAT17(in_stack_fffffffffffffdbf,
                           CONCAT16(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8)));
  Directory::rootNode(&local_148);
  std::
  map<int,_CompoundFile::Directory,_std::less<int>,_std::allocator<std::pair<const_int,_CompoundFile::Directory>_>_>
  ::operator[](this_02,(key_type *)CONCAT44(SVar1.m_id,iVar2));
  Directory::operator=((Directory *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  Directory::Directory((Directory *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  loadChildDirectories
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  Directory::~Directory((Directory *)0x12c3f1);
  Directory::~Directory((Directory *)0x12c3fe);
  Directory::~Directory((Directory *)0x12c40b);
  Stream::~Stream(in_stack_fffffffffffffd30);
  MSAT::~MSAT((MSAT *)0x12c425);
  return;
}

Assistant:

inline void
File::initialize( const std::string & fileName )
{
	if( m_stream.good() )
	{
		m_header.load( m_stream );

		MSAT msat( m_header, m_stream );
		m_sat = msat.buildSAT();

		m_ssat = loadSSAT( m_header, m_stream, m_sat );

		Stream stream( m_header, m_sat, m_header.dirStreamSecID(), m_stream );

		Directory root;
		root.load( stream );

		m_shortStreamFirstSector = root.streamSecID();

		stream.seek( root.rootNode() * dirRecordSize, Stream::FromBeginning );

		Directory rootEntry;
		rootEntry.load( stream );

		m_dirs[ root.rootNode() ] = rootEntry;

		loadChildDirectories( m_dirs, rootEntry, stream );
	}
	else
		throw Exception( std::wstring( L"Unable to open file : " ) +
			std::wstring( fileName.cbegin(), fileName.cend() ) );
}